

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Write.cpp
# Opt level: O0

void idx2::WriteChunkExponents(idx2_file *Idx2,encode_data *E,sub_channel *Sc,i8 Level,i8 Subband)

{
  long lVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  unsigned_long *Key;
  byte local_4b1;
  double local_448;
  double local_440;
  double local_420;
  double local_418;
  long local_400;
  u64 ChunkExpAddress;
  array<unsigned_char> *ExpBuffer;
  bitstream *ChunkEMaxSzs;
  chunk_exp_info *Ce;
  chunk_exp_info ChunkExpInfo;
  iterator CemIt;
  file_id FileId;
  i8 Subband_local;
  i8 Level_local;
  sub_channel *Sc_local;
  encode_data *E_local;
  idx2_file *Idx2_local;
  int BytePos;
  double local_2d0;
  double *local_2c8;
  double local_2c0;
  double *local_2b8;
  bitstream *local_2b0;
  bitstream *local_2a8;
  bitstream *local_2a0;
  bitstream *local_298;
  bitstream *local_288;
  bitstream *local_280;
  bitstream *local_278;
  bitstream *local_270;
  allocator **local_268;
  mallocator *local_260;
  undefined8 local_258;
  chunk_exp_info **local_250;
  unsigned_long local_248;
  i64 NewCapacity;
  i64 OriginalCapacity;
  unsigned_long *local_230;
  unsigned_long *local_228;
  int local_21c;
  byte *pbStack_218;
  int BytesWritten;
  array<unsigned_char> *local_210;
  u64 local_208;
  i64 NewCapacity_1;
  i64 Size;
  byte *local_1f0;
  array<unsigned_char> *local_1e8;
  undefined2 local_1dc;
  i8 local_1da;
  i8 local_1d9;
  ulong local_1d8;
  idx2_file *local_1d0;
  long *local_1c8;
  array<unsigned_long> *local_1c0;
  unsigned_long *local_1b8;
  double *local_1b0;
  double *local_1a8;
  double *local_1a0;
  double *local_198;
  double *local_190;
  double *local_188;
  double *local_180;
  double *local_178;
  allocator *local_170;
  byte *local_168;
  byte *local_160;
  u64 *local_158;
  undefined1 local_150 [8];
  buffer NewBuf;
  int BytePos_2;
  int BytePos_1;
  i8 I;
  
  *(u64 *)(Sc->BrickExpStream).BitPtr = (Sc->BrickExpStream).BitBuf;
  iVar3 = (Sc->BrickExpStream).BitPos >> 3;
  if (0 < iVar3) {
    (Sc->BrickExpStream).BitBuf =
         ((Sc->BrickExpStream).BitBuf >> 1) >> ((char)(iVar3 << 3) - 1U & 0x3f);
  }
  (Sc->BrickExpStream).BitPtr = (Sc->BrickExpStream).BitPtr + iVar3;
  (Sc->BrickExpStream).BitPos = (Sc->BrickExpStream).BitPos & 7;
  local_298 = &Sc->BrickExpStream;
  local_2c0 = (double)(long)((Sc->BrickExpStream).BitPtr +
                            ((long)(((Sc->BrickExpStream).BitPos + 7) / 8) -
                            (long)(local_298->Stream).Data));
  local_2b8 = &UncompressedExpChunksStat;
  local_1a8 = &UncompressedExpChunksStat;
  local_1b0 = &local_2c0;
  local_418 = local_2c0;
  if (UncompressedExpChunksStat <= local_2c0) {
    local_418 = UncompressedExpChunksStat;
  }
  UncompressedExpChunksStat = local_418;
  local_188 = &DAT_00300468;
  local_190 = &local_2c0;
  local_420 = local_2c0;
  if (local_2c0 <= DAT_00300468) {
    local_420 = DAT_00300468;
  }
  DAT_00300468 = local_420;
  DAT_00300470 = local_2c0 + DAT_00300470;
  DAT_00300478 = DAT_00300478 + 1;
  DAT_00300480 = local_2c0 * local_2c0 + DAT_00300480;
  local_280 = &E->ChunkExpStream;
  (E->ChunkExpStream).BitPtr = (local_280->Stream).Data;
  (E->ChunkExpStream).BitPos = 0;
  (E->ChunkExpStream).BitBuf = 0;
  local_278 = &Sc->BrickExpStream;
  local_160 = (local_278->Stream).Data;
  local_168 = (Sc->BrickExpStream).BitPtr +
              ((long)(((Sc->BrickExpStream).BitPos + 7) / 8) - (long)(local_278->Stream).Data);
  local_170 = (Sc->BrickExpStream).Stream.Alloc;
  local_158 = &FileId.Id;
  local_270 = local_278;
  FileId.Id = (u64)local_160;
  CompressBufZstd((buffer *)&FileId.Id,&E->ChunkExpStream);
  local_2a0 = &E->ChunkExpStream;
  local_2d0 = (double)(long)((E->ChunkExpStream).BitPtr +
                            ((long)(((E->ChunkExpStream).BitPos + 7) / 8) -
                            (long)(local_2a0->Stream).Data));
  local_2c8 = &CompressedExpChunksStat;
  local_198 = &CompressedExpChunksStat;
  local_1a0 = &local_2d0;
  local_440 = local_2d0;
  if (CompressedExpChunksStat <= local_2d0) {
    local_440 = CompressedExpChunksStat;
  }
  CompressedExpChunksStat = local_440;
  local_178 = &DAT_00300490;
  local_180 = &local_2d0;
  local_448 = local_2d0;
  if (local_2d0 <= DAT_00300490) {
    local_448 = DAT_00300490;
  }
  DAT_00300490 = local_448;
  DAT_00300498 = local_2d0 + DAT_00300498;
  DAT_003004a0 = DAT_003004a0 + 1;
  DAT_003004a8 = local_2d0 * local_2d0 + DAT_003004a8;
  local_288 = &Sc->BrickExpStream;
  (Sc->BrickExpStream).BitPtr = (local_288->Stream).Data;
  (Sc->BrickExpStream).BitPos = 0;
  (Sc->BrickExpStream).BitBuf = 0;
  Key = (unsigned_long *)(ulong)(uint)(int)Level;
  ConstructFilePath((file_id *)&CemIt.Idx,Idx2,Sc->LastBrick,Level,Subband,0);
  Lookup<unsigned_long,idx2::chunk_exp_info>
            ((iterator *)&ChunkExpInfo.FileExpBuffer.Alloc,(idx2 *)&E->ChunkExponents,
             (hash_table<unsigned_long,_idx2::chunk_exp_info> *)&FileId.Name.Size,Key);
  local_268 = &ChunkExpInfo.FileExpBuffer.Alloc;
  if (*(char *)((long)&(CemIt.Ht)->Keys +
               (long)&(((CemIt.Val)->ExpSizes).Stream.Alloc)->_vptr_allocator) != '\x02') {
    chunk_exp_info::chunk_exp_info((chunk_exp_info *)&Ce);
    local_260 = Mallocator();
    local_258 = 0x80;
    local_250 = &Ce;
    (**(local_260->super_allocator)._vptr_allocator)(local_260,&Ce,0x88);
    local_250[3] = *local_250;
    *(undefined4 *)(local_250 + 5) = 0;
    local_250[4] = (chunk_exp_info *)0x0;
    Insert<unsigned_long,idx2::chunk_exp_info>
              ((iterator *)&ChunkExpInfo.FileExpBuffer.Alloc,(unsigned_long *)&FileId.Name.Size,
               (chunk_exp_info *)&Ce);
  }
  ChunkEMaxSzs = (bitstream *)CemIt.Key;
  ExpBuffer = (array<unsigned_char> *)CemIt.Key;
  local_230 = CemIt.Key;
  OriginalCapacity = 4;
  local_1b8 = CemIt.Key;
  NewCapacity = CemIt.Key[1];
  for (local_248 = NewCapacity; local_228 = CemIt.Key,
      (long)local_248 <=
      (long)((CemIt.Key[3] - *CemIt.Key) + (long)(((int)CemIt.Key[5] + 7) / 8) + 0xc);
      local_248 = (long)(local_248 * 3) / 2 + 8) {
  }
  if ((NewCapacity < (long)local_248) &&
     (NewBuf.Alloc = (allocator *)(local_248 + 8), (long)CemIt.Key[1] < (long)NewBuf.Alloc)) {
    NewBuf.Bytes = (i64)Mallocator();
    local_150 = (undefined1  [8])0x0;
    NewBuf.Data = (byte *)0x0;
    AllocBuf((buffer *)local_150,(i64)NewBuf.Alloc,(allocator *)CemIt.Key[2]);
    MemCopy((buffer *)CemIt.Key,(buffer *)local_150,
            (CemIt.Key[3] - *CemIt.Key) + (long)(((int)CemIt.Key[5] + 7) / 8));
    CemIt.Key[3] = (unsigned_long)((long)local_150 + (CemIt.Key[3] - *CemIt.Key));
    DeallocBuf((buffer *)CemIt.Key);
    *CemIt.Key = (unsigned_long)local_150;
    CemIt.Key[1] = (unsigned_long)NewBuf.Data;
    CemIt.Key[2] = NewBuf.Bytes;
  }
  local_2a8 = &E->ChunkExpStream;
  pbStack_218 = (E->ChunkExpStream).BitPtr +
                ((long)(((E->ChunkExpStream).BitPos + 7) / 8) - (long)(local_2a8->Stream).Data);
  local_210 = ExpBuffer;
  local_21c = 0;
  do {
    local_21c = local_21c + 1;
    if (local_21c == 0) break;
    if (0x3f < *(int *)&ExpBuffer->Alloc + 7) {
      *(i64 *)ExpBuffer->Size = ExpBuffer->Capacity;
      iVar3 = *(int *)&ExpBuffer->Alloc >> 3;
      if (0 < iVar3) {
        ExpBuffer->Capacity = ((ulong)ExpBuffer->Capacity >> 1) >> ((char)(iVar3 << 3) - 1U & 0x3f);
      }
      ExpBuffer->Size = ExpBuffer->Size + (long)iVar3;
      *(uint *)&ExpBuffer->Alloc = *(uint *)&ExpBuffer->Alloc & 7;
    }
    ExpBuffer->Capacity =
         ((ulong)pbStack_218 & 0x7f & bitstream::Masks.Arr[7]) <<
         ((byte)*(undefined4 *)&ExpBuffer->Alloc & 0x3f) | ExpBuffer->Capacity;
    *(int *)&ExpBuffer->Alloc = *(int *)&ExpBuffer->Alloc + 7;
    pbStack_218 = (byte *)((ulong)pbStack_218 >> 7);
    if (0x3f < *(int *)&ExpBuffer->Alloc + 1) {
      *(i64 *)ExpBuffer->Size = ExpBuffer->Capacity;
      iVar3 = *(int *)&ExpBuffer->Alloc >> 3;
      if (0 < iVar3) {
        ExpBuffer->Capacity = ((ulong)ExpBuffer->Capacity >> 1) >> ((char)(iVar3 << 3) - 1U & 0x3f);
      }
      ExpBuffer->Size = ExpBuffer->Size + (long)iVar3;
      *(uint *)&ExpBuffer->Alloc = *(uint *)&ExpBuffer->Alloc & 7;
    }
    ExpBuffer->Capacity =
         (pbStack_218 != (byte *)0x0 & bitstream::Masks.Arr[1]) <<
         ((byte)*(undefined4 *)&ExpBuffer->Alloc & 0x3f) | ExpBuffer->Capacity;
    *(int *)&ExpBuffer->Alloc = *(int *)&ExpBuffer->Alloc + 1;
  } while (pbStack_218 != (byte *)0x0);
  ChunkExpAddress = (u64)(ChunkEMaxSzs + 2);
  local_1f0 = (E->ChunkExpStream).Stream.Data;
  local_2b0 = &E->ChunkExpStream;
  Size = (i64)((E->ChunkExpStream).BitPtr +
              ((long)(((E->ChunkExpStream).BitPos + 7) / 8) - (long)(local_2b0->Stream).Data));
  NewCapacity_1 = (i64)ChunkEMaxSzs[2].BitPtr;
  for (local_208 = ChunkEMaxSzs[2].BitBuf; (long)local_208 <= (long)(NewCapacity_1 + Size);
      local_208 = (long)(local_208 * 3) / 2 + 8) {
  }
  local_1e8 = (array<unsigned_char> *)ChunkExpAddress;
  GrowCapacity<unsigned_char>((array<unsigned_char> *)ChunkExpAddress,local_208);
  if ((local_1e8->Buffer).Bytes <= NewCapacity_1) {
    __assert_fail("Idx < Bytes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Memory.h"
                  ,0x165,"byte &idx2::buffer::operator[](i64) const");
  }
  memcpy((local_1e8->Buffer).Data + NewCapacity_1,local_1f0,Size);
  local_1e8->Size = NewCapacity_1 + Size;
  local_1d8 = Sc->LastBrick;
  local_1dc = 0;
  local_1da = Subband;
  local_1d9 = Level;
  local_1d0 = Idx2;
  if (0xf < Level) {
    __assert_fail("Idx < N",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                  ,0x20c,"t &idx2::stack_array<int, 16>::operator[](int) const [t = int, N = 16]");
  }
  uVar4 = (ulong)(Idx2->BricksPerChunk).Arr[(int)Level];
  if (uVar4 == 0) {
    local_4b1 = 0xff;
  }
  else {
    lVar1 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    local_4b1 = 0x3f - ((byte)lVar1 ^ 0x3f);
  }
  local_400 = ((long)Level << 0x3c) +
              (local_1d8 >> (local_4b1 + (uVar4 != 1L << (local_4b1 & 0x3f)) & 0x3f)) * 0x40000 +
              (long)((int)Subband << 0xc);
  local_1c0 = (array<unsigned_long> *)(ChunkEMaxSzs + 1);
  local_1c8 = &local_400;
  if ((long)ChunkEMaxSzs[1].BitBuf <= (long)ChunkEMaxSzs[1].BitPtr) {
    GrowCapacity<unsigned_long>(local_1c0,0);
  }
  lVar1 = *local_1c8;
  lVar2 = local_1c0->Size;
  local_1c0->Size = lVar2 + 1;
  *(long *)((local_1c0->Buffer).Data + lVar2 * 8) = lVar1;
  (E->ChunkExpStream).BitPtr = (E->ChunkExpStream).Stream.Data;
  (E->ChunkExpStream).BitPos = 0;
  (E->ChunkExpStream).BitBuf = 0;
  return;
}

Assistant:

void
WriteChunkExponents(const idx2_file& Idx2, encode_data* E, sub_channel* Sc, i8 Level, i8 Subband)
{
#if VISUS_IDX2
  if (Idx2.external_write){

    /* brick exponents */
    Flush(&Sc->BrickExpStream);
    UncompressedExpChunksStat.Add((f64)Size(Sc->BrickExpStream));
    Rewind(&E->ChunkExpStream);
    CompressBufZstd(ToBuffer(Sc->BrickExpStream), &E->ChunkExpStream);
    CompressedExpChunksStat.Add((f64)Size(E->ChunkExpStream));
    Rewind(&Sc->BrickExpStream);
    u64 ChunkExpAddress = GetChunkAddress(Idx2, Sc->LastBrick, Level, Subband, ExponentBitPlane_);
    buffer Buf = ToBuffer(E->ChunkExpStream);
    if (!Idx2.external_write(Idx2, Buf, ChunkExpAddress))
      idx2_ExitIf(true, "Write chunk exponent failed\n");
    Rewind(&E->ChunkExpStream);
    return;
  }
#endif

  /* brick exponents */
  Flush(&Sc->BrickExpStream);
  UncompressedExpChunksStat.Add((f64)Size(Sc->BrickExpStream));
  Rewind(&E->ChunkExpStream);
  CompressBufZstd(ToBuffer(Sc->BrickExpStream), &E->ChunkExpStream);
  CompressedExpChunksStat.Add((f64)Size(E->ChunkExpStream));

  /* rewind */
  Rewind(&Sc->BrickExpStream);

  /* write to file */
  file_id FileId = ConstructFilePath(Idx2, Sc->LastBrick, Level, Subband, ExponentBitPlane_);
  /* keep track of the chunk sizes */
  auto CemIt = Lookup(E->ChunkExponents, FileId.Id);
  if (!CemIt)
  {
    chunk_exp_info ChunkExpInfo;
    InitWrite(&ChunkExpInfo.ExpSizes, 128);
    //Init(&ChunkEMaxInfo.FileEMaxBuffer, 128);
    Insert(&CemIt, FileId.Id, ChunkExpInfo);
  }
  chunk_exp_info* Ce = CemIt.Val;
  bitstream* ChunkEMaxSzs = &Ce->ExpSizes;
  GrowToAccomodate(ChunkEMaxSzs, 4);
  // write the size of the exponent stream for current chunk
  WriteVarByte(ChunkEMaxSzs, Size(E->ChunkExpStream));
  array<u8>* ExpBuffer = &Ce->FileExpBuffer;
  // write the exponents to the exponent buffer for the whole file
  PushBack(ExpBuffer, E->ChunkExpStream.Stream.Data, Size(E->ChunkExpStream));
  //printf("%lld %lld\n", Size(E->ChunkExpStream), Size(*EMaxBuffer));
  u64 ChunkExpAddress = GetChunkAddress(Idx2, Sc->LastBrick, Level, Subband, ExponentBitPlane_);
  PushBack(&Ce->Addrs, ChunkExpAddress);
  Rewind(&E->ChunkExpStream);
}